

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O1

cio_error stream_write(cio_io_stream *stream,cio_write_buffer *buffer,
                      cio_io_stream_write_handler_t handler,void *handler_context)

{
  int __fd;
  cio_eventloop *loop;
  long lVar1;
  cio_error cVar2;
  size_t sVar3;
  int *piVar4;
  size_t *psVar5;
  cio_write_buffer *pcVar6;
  undefined8 uStack_80;
  undefined1 auStack_78 [8];
  msghdr local_70;
  undefined1 *local_38;
  
  local_38 = auStack_78;
  uStack_80 = 0xffffffffffffffea;
  cVar2 = CIO_INVALID_ARGUMENT;
  if (((stream != (cio_io_stream *)0x0) && (buffer != (cio_write_buffer *)0x0)) &&
     (handler != (cio_io_stream_write_handler_t)0x0)) {
    sVar3 = (buffer->data).head.q_len;
    lVar1 = sVar3 * -0x10;
    local_70.msg_iov = (iovec *)(auStack_78 + lVar1);
    local_70.msg_name = (void *)0x0;
    local_70.msg_namelen = 0;
    local_70.msg_flags = 0;
    local_70.msg_control = (void *)0x0;
    local_70.msg_controllen = 0;
    local_70.msg_iovlen = sVar3;
    if (sVar3 != 0) {
      psVar5 = (size_t *)(auStack_78 + lVar1 + 8);
      pcVar6 = buffer;
      local_38 = auStack_78;
      do {
        pcVar6 = pcVar6->next;
        *(anon_union_8_2_1b11d445_for_anon_struct_16_2_5bd11894_for_element_0 *)(psVar5 + -1) =
             (pcVar6->data).element.field_0;
        *psVar5 = (pcVar6->data).element.length;
        psVar5 = psVar5 + 2;
        sVar3 = sVar3 - 1;
      } while (sVar3 != 0);
    }
    __fd = *(int *)&stream[1].write_handler;
    *(undefined8 *)(auStack_78 + lVar1 + -8) = 0x103c16;
    sVar3 = sendmsg(__fd,(msghdr *)(auStack_78 + 8),0x4000);
    if ((long)sVar3 < 0) {
      *(undefined8 *)(auStack_78 + lVar1 + -8) = 0x103c49;
      piVar4 = __errno_location();
      if (*piVar4 == 0xb) {
        stream->write_handler = handler;
        stream->write_handler_context = handler_context;
        stream->write_buffer = buffer;
        stream[1].write_buffer = (cio_write_buffer *)stream;
        stream[1].read_buffer = (cio_read_buffer *)write_callback;
        loop = (cio_eventloop *)stream[2].write_handler;
        *(undefined8 *)(auStack_78 + lVar1 + -8) = 0x103c7d;
        cVar2 = cio_linux_eventloop_register_write
                          (loop,(cio_event_notifier *)&stream[1].read_handler_context);
      }
      else {
        cVar2 = -*piVar4;
      }
    }
    else {
      cVar2 = CIO_SUCCESS;
      *(undefined8 *)(auStack_78 + lVar1 + -8) = 0x103c2e;
      (*handler)(stream,handler_context,buffer,CIO_SUCCESS,sVar3);
    }
  }
  return cVar2;
}

Assistant:

static enum cio_error stream_write(struct cio_io_stream *stream, struct cio_write_buffer *buffer, cio_io_stream_write_handler_t handler, void *handler_context)
{
	if (cio_unlikely((stream == NULL) || (buffer == NULL) || (handler == NULL))) {
		return CIO_INVALID_ARGUMENT;
	}

	struct cio_socket *socket = cio_container_of(stream, struct cio_socket, stream);
	size_t chain_length = cio_write_buffer_get_num_buffer_elements(buffer);
	struct iovec msg_iov[chain_length];
	struct msghdr msg;
	msg.msg_name = NULL;
	msg.msg_namelen = 0;
	msg.msg_control = NULL;
	msg.msg_controllen = 0;
	msg.msg_flags = 0;
	msg.msg_iov = msg_iov;
	msg.msg_iovlen = chain_length;

	const struct cio_write_buffer *write_buffer = buffer->next;
	for (size_t i = 0; i < chain_length; i++) {
		msg_iov[i].iov_base = write_buffer->data.element.data;
		msg_iov[i].iov_len = write_buffer->data.element.length;
		write_buffer = write_buffer->next;
	}

	ssize_t ret = sendmsg(socket->impl.ev.fd, &msg, MSG_NOSIGNAL);
	if (cio_likely(ret >= 0)) {
		handler(stream, handler_context, buffer, CIO_SUCCESS, (size_t)ret);
	} else {
		if (cio_likely(errno == EAGAIN)) {
			socket->stream.write_handler = handler;
			socket->stream.write_handler_context = handler_context;
			socket->stream.write_buffer = buffer;
			socket->impl.ev.context = stream;
			socket->impl.ev.write_callback = write_callback;
			return cio_linux_eventloop_register_write(socket->impl.loop, &socket->impl.ev);
		}

		return (enum cio_error)(-errno);
	}

	return CIO_SUCCESS;
}